

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

any __thiscall
cs_impl::any::
make<std::deque<cs_impl::any,std::allocator<cs_impl::any>>,std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
          (any *this,deque<cs_impl::any,_std::allocator<cs_impl::any>_> *args)

{
  proxy *ppVar1;
  int local_1c;
  holder<std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>_> *local_18;
  
  local_1c = 1;
  local_18 = cs::
             allocator_type<cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>,64ul,cs_impl::default_allocator_provider>
             ::alloc<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>
                       ((allocator_type<cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>,64ul,cs_impl::default_allocator_provider>
                         *)holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>::allocator,
                        args);
  ppVar1 = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
           alloc<int,cs_impl::any::holder<std::deque<cs_impl::any,std::allocator<cs_impl::any>>>*>
                     ((allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>
                       *)allocator,&local_1c,&local_18);
  this->mDat = ppVar1;
  return (any)(proxy *)this;
}

Assistant:

static any make(ArgsT &&...args)
		{
			return any(allocator.alloc(1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}